

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

void Fra_ClauRemapClause(int *pMap,Vec_Int_t *vClause,Vec_Int_t *vRemapped,int fInv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  lit Entry;
  int local_2c;
  int i;
  int iLit;
  int fInv_local;
  Vec_Int_t *vRemapped_local;
  Vec_Int_t *vClause_local;
  int *pMap_local;
  
  Vec_IntClear(vRemapped);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vClause);
    if (iVar1 <= local_2c) {
      return;
    }
    iVar1 = Vec_IntEntry(vClause,local_2c);
    iVar2 = lit_var(iVar1);
    if (pMap[iVar2] < 0) break;
    iVar2 = lit_var(iVar1);
    iVar2 = pMap[iVar2];
    uVar3 = lit_sign(iVar1);
    Entry = toLitCond(iVar2,uVar3 ^ fInv);
    Vec_IntPush(vRemapped,Entry);
    local_2c = local_2c + 1;
  }
  __assert_fail("pMap[lit_var(iLit)] >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,0x198,"void Fra_ClauRemapClause(int *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

void Fra_ClauRemapClause( int * pMap, Vec_Int_t * vClause, Vec_Int_t * vRemapped, int fInv )
{
    int iLit, i;
    Vec_IntClear( vRemapped );
    Vec_IntForEachEntry( vClause, iLit, i )
    {
        assert( pMap[lit_var(iLit)] >= 0 );
        iLit = toLitCond( pMap[lit_var(iLit)], lit_sign(iLit) ^ fInv );
        Vec_IntPush( vRemapped, iLit );
    }
}